

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Mat *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int *piVar5;
  string sVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ostream *poVar11;
  int *piVar12;
  undefined8 uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Size SVar21;
  bool bVar22;
  long lVar23;
  _InputArray *p_Var24;
  uint uVar25;
  undefined4 uVar26;
  float fVar27;
  float fVar28;
  CommandLineParser parser;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dx;
  string keys;
  Mat grad_iii;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rois;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels_log;
  int val_6;
  Mat reconstructed_img;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dy;
  Mat img;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_grad;
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_channels;
  Mat filter_gx;
  Mat edges_to_remove;
  string img1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_log_channels;
  Mat illuminant_invariant_img;
  Mat log_r_g;
  Mat S_lap;
  Mat log_b_g;
  Mat S_x_dx;
  Mat filter_gy;
  Mat S_y_dy;
  Mat illuminant_invariant_img_exp;
  CommandLineParser local_870 [8];
  Size local_868;
  long local_860;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_858;
  ulong local_840;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_838;
  long *local_820 [2];
  long local_810 [2];
  pointer local_800;
  ulong local_7f8;
  float local_7ec;
  String local_7e8 [3];
  undefined1 local_788 [72];
  long *local_740;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_728;
  undefined8 local_710;
  Mat *local_708;
  undefined8 local_700;
  _InputArray local_6f8 [3];
  long *local_6b0;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688 [3];
  ulong *local_658;
  long *local_650;
  Mat local_628 [96];
  Mat local_5c8 [144];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_538;
  float local_518 [2];
  int local_510;
  uint uStack_50c;
  long local_508;
  long *local_4d0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  ulong local_480 [4];
  ulong local_460 [4];
  uint local_440 [3];
  int local_434;
  undefined4 *local_430;
  int *local_400;
  long *local_3f8;
  long *local_3e0 [2];
  long local_3d0 [7];
  long *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_360;
  Mat local_348 [8];
  int local_340;
  uint local_33c;
  long local_338;
  long *local_300;
  _InputArray local_2e8 [2];
  ulong *local_2a8;
  long *local_2a0;
  undefined4 local_288 [2];
  _InputArray *local_280;
  long lStack_278;
  long *local_240;
  undefined8 local_228;
  undefined8 local_220;
  ulong local_218;
  Mat local_210 [16];
  long local_200;
  long *local_1c8;
  _InputArray local_1b0 [4];
  Mat local_150 [96];
  _OutputArray local_f0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [3];
  
  cv::Mat::Mat((Mat *)local_440,1,3,5);
  if ((local_440[0] >> 0xe & 1) == 0) {
    *local_430 = 0xbf000000;
    if (*local_400 == 1) goto LAB_001149e2;
    if (local_400[1] != 1) goto LAB_00115654;
    puVar14 = (undefined4 *)((long)local_430 + *local_3f8);
  }
  else {
    *local_430 = 0xbf000000;
LAB_001149e2:
    puVar14 = local_430 + 1;
  }
  while( true ) {
    *puVar14 = 0;
    if (((local_440[0] >> 0xe & 1) == 0) && (*local_400 != 1)) {
      if (local_400[1] == 1) {
        puVar14 = (undefined4 *)(*local_3f8 * 2 + (long)local_430);
      }
      else {
        puVar14 = (undefined4 *)
                  ((long)local_430 +
                  (2 % (long)local_434 & 0xffffffffU) * 4 +
                  (long)(int)(2 / (long)local_434) * *local_3f8);
      }
    }
    else {
      puVar14 = local_430 + 2;
    }
    *puVar14 = 0x3f000000;
    cv::Mat::t();
    cv::Mat::Mat(local_150);
    (**(code **)(*(long *)local_698._0_8_ + 0x18))(local_698._0_8_,local_698,local_150,0xffffffff);
    cv::Mat::~Mat(local_5c8);
    cv::Mat::~Mat(local_628);
    this = (Mat *)(local_698 + 0x10);
    cv::Mat::~Mat(this);
    local_820[0] = local_810;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_820,
               "{help h usage ? |      | print this message                                                        }{@image1        |      | image1 for compare                                                        }{roi            |      | roi to delete canny edges                                                 }{thrs1          |200   | Canny threshold for grayscale image                                       }{thrs2          |200   | Canny threshold for invariant image                                       }{c1             |0.5463| Illuminant invariant direction c1                                         }{c2             |-0.837| Illuminant invariant direction c2                                         }{calibrate      |false | Manually calibrate [c1, c2] direction                                     }{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
               ,"");
    cv::CommandLineParser::CommandLineParser(local_870,argc,argv,(string *)local_820);
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"help","");
    cVar7 = cv::CommandLineParser::has((string *)local_870);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    if (cVar7 != '\0') {
      cv::CommandLineParser::printMessage();
      goto LAB_001166ee;
    }
    cv::CommandLineParser::get<std::__cxx11::string>(&local_380,local_870,0,true);
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"thrs1","");
    local_518[0] = 0.0;
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x7);
    local_840 = CONCAT44(local_840._4_4_,local_518[0]);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"thrs2","");
    local_518[0] = 0.0;
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x7);
    local_7ec = local_518[0];
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"c1","");
    local_518[0] = 0.0;
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x7);
    local_860 = CONCAT44(local_860._4_4_,local_518[0]);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"c2","");
    local_518[0] = 0.0;
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x7);
    local_7f8 = CONCAT44(local_7f8._4_4_,local_518[0]);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"calibrate","");
    local_518[0] = (float)((uint)local_518[0] & 0xffffff00);
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x1);
    sVar6 = local_518[0]._0_1_;
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"mode","");
    local_518[0] = 0.0;
    cv::CommandLineParser::getByName((string *)local_870,SUB81(local_698,0),BOOLEAN,(void *)0x0);
    local_800 = (pointer)CONCAT44(local_800._4_4_,local_518[0]);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    cv::imread((string *)local_518,(int)&local_380);
    local_698._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Original","");
    local_2e8[0].sz.width = 0;
    local_2e8[0].sz.height = 0;
    local_2e8[0].flags = 0x1010000;
    local_2e8[0].obj = (string *)local_518;
    cv::imshow((string *)local_698,local_2e8);
    if ((Mat *)local_698._0_8_ != this) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    cv::Mat::Mat((Mat *)local_2e8,local_510,uStack_50c,5);
    cv::Mat::Mat(local_210,local_510,uStack_50c,5);
    if (0 < local_510) {
      lVar20 = 0;
      do {
        if (0 < (int)uStack_50c) {
          lVar23 = 2;
          lVar16 = 0;
          do {
            lVar10 = *local_4d0 * lVar20 + local_508;
            bVar2 = *(byte *)(lVar23 + -2 + lVar10);
            bVar3 = *(byte *)(lVar23 + -1 + lVar10);
            bVar4 = *(byte *)(lVar23 + lVar10);
            *(undefined4 *)(*local_2a0 * lVar20 + (long)local_2e8[0].sz + lVar16 * 4) = 0;
            *(undefined4 *)(*local_1c8 * lVar20 + local_200 + lVar16 * 4) = 0;
            if (bVar3 != 0) {
              fVar28 = (float)bVar3;
              if (bVar4 != 0) {
                local_868.width = (int)fVar28;
                fVar28 = logf((float)bVar4 / fVar28);
                *(float *)(*local_2a0 * lVar20 + (long)local_2e8[0].sz + lVar16 * 4) = fVar28;
                fVar28 = (float)local_868.width;
              }
              if (bVar2 != 0) {
                fVar28 = logf((float)bVar2 / fVar28);
                *(float *)(*local_1c8 * lVar20 + local_200 + lVar16 * 4) = fVar28;
              }
            }
            lVar16 = lVar16 + 1;
            lVar23 = lVar23 + 3;
          } while (lVar16 < (int)uStack_50c);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < local_510);
    }
    local_218 = *local_2a8 << 0x20 | *local_2a8 >> 0x20;
    cv::Mat::Mat(local_348,&local_218,5);
    if (0 < (long)local_340) {
      lVar20 = 0;
      do {
        if (0 < (int)local_33c) {
          lVar16 = *local_1c8;
          lVar23 = *local_300;
          lVar10 = *local_2a0;
          uVar17 = 0;
          do {
            *(float *)(lVar23 * lVar20 + local_338 + uVar17 * 4) =
                 ABS(*(float *)(lVar10 * lVar20 + (long)local_2e8[0].sz + uVar17 * 4) *
                     (float)local_860 -
                     *(float *)(lVar16 * lVar20 + local_200 + uVar17 * 4) * (float)local_7f8);
            uVar17 = uVar17 + 1;
          } while (local_33c != uVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != local_340);
    }
    cv::Mat::Mat((Mat *)local_90);
    if (sVar6 != (string)0x0) {
      local_3e0[0] = local_3d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3e0,"Invariant direction slider","");
      local_7e8[0]._M_dataplus._M_p = (pointer)&local_7e8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"ids","");
      cv::namedWindow((string *)local_3e0,1);
      local_6f8[0]._0_8_ = local_6f8[0]._0_8_ & 0xffffffff00000000;
      cv::createTrackbar((string *)local_7e8,(string *)local_3e0,&local_6f8[0].flags,1000,
                         onIDSslider,(void *)0x0);
      iVar9 = -1;
      bVar22 = false;
      do {
        iVar8 = local_6f8[0].flags;
        if (local_6f8[0].flags != iVar9) {
          fVar28 = cosf(((float)local_6f8[0].flags / 1000.0 + (float)local_6f8[0].flags / 1000.0) *
                        3.141592);
          local_868.width = (int)fVar28;
          fVar28 = sinf(((float)local_6f8[0].flags / 1000.0 + (float)local_6f8[0].flags / 1000.0) *
                        3.141592);
          local_860 = CONCAT44(local_860._4_4_,fVar28);
          poVar11 = std::ostream::_M_insert<double>((double)(float)local_868.width);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
          poVar11 = std::ostream::_M_insert<double>((double)(float)local_860);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if (0 < (long)local_340) {
            lVar20 = 0;
            do {
              if (0 < (int)local_33c) {
                lVar16 = *local_1c8;
                lVar23 = *local_300;
                lVar10 = *local_2a0;
                uVar17 = 0;
                do {
                  *(float *)(lVar23 * lVar20 + local_338 + uVar17 * 4) =
                       ABS(*(float *)(lVar10 * lVar20 + (long)local_2e8[0].sz + uVar17 * 4) *
                           (float)local_868.width -
                           *(float *)(lVar16 * lVar20 + local_200 + uVar17 * 4) * (float)local_860);
                  uVar17 = uVar17 + 1;
                } while (local_33c != uVar17);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != local_340);
          }
          local_688[0]._0_4_ = 0;
          local_688[0]._4_4_ = 0;
          local_698._0_4_ = 0x1010000;
          local_698._8_8_ = local_348;
          local_788._16_4_ = 0;
          local_788._20_4_ = 0;
          local_788._0_4_ = 0x2010000;
          local_788._8_8_ = local_90;
          cv::exp((_InputArray *)local_698,(_OutputArray *)local_788);
          cv::operator/((Mat *)local_698,2.0);
          cv::_InputArray::_InputArray((_InputArray *)local_788,(MatExpr *)local_698);
          cv::imshow((string *)local_3e0,(_InputArray *)local_788);
          cv::Mat::~Mat(local_5c8);
          cv::Mat::~Mat(local_628);
          cv::Mat::~Mat((Mat *)(local_698 + 0x10));
          iVar9 = iVar8;
        }
        iVar8 = cv::waitKey(0x32);
        if (iVar8 == 0x1b) {
          bVar22 = true;
        }
      } while (!bVar22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8[0]._M_dataplus._M_p != &local_7e8[0].field_2) {
        operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_3e0[0] != local_3d0) {
        operator_delete(local_3e0[0],local_3d0[0] + 1);
      }
    }
    argv = (char **)local_3e0;
    cv::Mat::Mat((Mat *)argv);
    if ((int)local_800 != 1) {
      if ((int)local_800 == 0) {
        calculateShadowEdges
                  (local_348,(Mat *)local_518,(Mat *)local_3e0,(int)local_7ec,(int)(float)local_840)
        ;
      }
      goto LAB_0011586b;
    }
    local_6f8[0].obj = (void *)(CONCAT44(uStack_50c,local_510) << 0x20 | (ulong)uStack_50c);
    local_6f8[0]._0_8_ = 0;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"roi","");
    cVar7 = cv::CommandLineParser::has((string *)local_870);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
    }
    if (cVar7 == '\0') goto LAB_00115848;
    paVar1 = &local_7e8[0].field_2;
    local_7e8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"roi","");
    cv::CommandLineParser::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698,
               local_870,local_7e8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
    }
    local_7e8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"x","");
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_788,(string *)local_698,local_7e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
    }
    if (local_788._8_8_ - local_788._0_8_ != 0x80) {
      __assert_fail("rois.size() == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/siposcsaba89[P]sriid/main.cpp"
                    ,0x8d,"int main(int, const char **)");
    }
    piVar5 = (int *)((_Alloc_hider *)local_788._0_8_)->_M_p;
    piVar12 = __errno_location();
    argc = *piVar12;
    *piVar12 = 0;
    fVar28 = strtof((char *)piVar5,(char **)local_7e8);
    if ((int *)local_7e8[0]._M_dataplus._M_p == piVar5) {
      std::__throw_invalid_argument("stof");
      goto LAB_00116768;
    }
    if (*piVar12 == 0) break;
    if (*piVar12 != 0x22) goto LAB_001156c3;
    local_440[0] = std::__throw_out_of_range("stof");
LAB_00115654:
    iVar9 = 0;
    if (local_434 + 1U < 3) {
      iVar9 = local_434;
    }
    puVar14 = (undefined4 *)
              ((long)local_430 + (long)(1 - local_434 * iVar9) * 4 + (long)iVar9 * *local_3f8);
  }
  *piVar12 = argc;
LAB_001156c3:
  local_6f8[0].flags = (int)(fVar28 * (float)(int)local_6f8[0].obj);
  piVar5 = (int *)(((pointer)(local_788._0_8_ + 0x20))->_M_dataplus)._M_p;
  iVar9 = *piVar12;
  *piVar12 = 0;
  fVar28 = strtof((char *)piVar5,(char **)local_7e8);
  if ((int *)local_7e8[0]._M_dataplus._M_p == piVar5) {
LAB_00116768:
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*piVar12 == 0) {
LAB_00115726:
      *piVar12 = iVar9;
    }
    else if (*piVar12 == 0x22) {
      fVar28 = (float)std::__throw_out_of_range("stof");
      goto LAB_00115726;
    }
    local_6f8[0]._4_4_ = (int)(fVar28 * (float)local_6f8[0].obj._4_4_);
    piVar5 = (int *)(((pointer)(local_788._0_8_ + 0x40))->_M_dataplus)._M_p;
    iVar9 = *piVar12;
    *piVar12 = 0;
    fVar28 = strtof((char *)piVar5,(char **)local_7e8);
    if ((int *)local_7e8[0]._M_dataplus._M_p != piVar5) {
      if (*piVar12 == 0) {
LAB_0011578f:
        *piVar12 = iVar9;
      }
      else if (*piVar12 == 0x22) {
        fVar28 = (float)std::__throw_out_of_range("stof");
        goto LAB_0011578f;
      }
      local_6f8[0].obj =
           (void *)CONCAT44(local_6f8[0].obj._4_4_,(int)(fVar28 * (float)(int)local_6f8[0].obj));
      piVar5 = (int *)(((pointer)(local_788._0_8_ + 0x60))->_M_dataplus)._M_p;
      iVar9 = *piVar12;
      *piVar12 = 0;
      fVar28 = strtof((char *)piVar5,(char **)local_7e8);
      if ((int *)local_7e8[0]._M_dataplus._M_p != piVar5) {
        if (*piVar12 != 0) {
          if (*piVar12 != 0x22) goto LAB_00115803;
          fVar28 = (float)std::__throw_out_of_range("stof");
        }
        *piVar12 = iVar9;
LAB_00115803:
        local_6f8[0].obj =
             (void *)CONCAT44((int)(fVar28 * (float)local_6f8[0].obj._4_4_),(int)local_6f8[0].obj);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_788);
        if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
          operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
        }
LAB_00115848:
        calculateShadowEdgesRoi
                  ((Mat *)local_518,(Rect *)local_6f8,(Mat *)local_3e0,(int)(float)local_840);
LAB_0011586b:
        local_698._0_8_ = local_698 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Edges to remove","");
        local_7e8[0].field_2._M_allocated_capacity = 0;
        local_7e8[0]._M_dataplus._M_p._0_4_ = 0x1010000;
        local_7e8[0]._M_string_length = (size_type)argv;
        cv::imshow((string *)local_698,(_InputArray *)local_7e8);
        if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
          operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
        }
        cv::waitKey(1);
        local_7e8[0]._M_string_length = (size_type)&local_858;
        local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_4b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_4b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_538.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_538.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_538.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_688[0]._0_4_ = 0;
        local_688[0]._4_4_ = 0;
        local_698._0_4_ = 0x1010000;
        local_698._8_8_ = local_518;
        local_7e8[0].field_2._M_allocated_capacity = 0;
        local_7e8[0]._M_dataplus._M_p._0_4_ = 0x2050000;
        cv::split((_InputArray *)local_698,(_OutputArray *)local_7e8);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
                  (&local_728,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
                  (&local_4b8,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
                  (&local_838,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
                  (&local_538,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        if (local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start) {
          SVar21.width = 0;
          SVar21.height = 0;
          do {
            cv::Mat::Mat((Mat *)local_698);
            lVar20 = (long)SVar21 * 0x60;
            local_7e8[0].field_2._M_allocated_capacity = 0;
            local_7e8[0]._M_dataplus._M_p._0_4_ = 0x2010000;
            local_7e8[0]._M_string_length = (size_type)local_698;
            cv::Mat::convertTo((_OutputArray *)
                               (local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar20),(int)local_7e8,
                               1.0,0.0);
            local_460[3] = *local_658 << 0x20 | *local_658 >> 0x20;
            local_868 = SVar21;
            cv::Mat::create(local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar20,local_460 + 3,5);
            if (0 < (int)local_698._8_4_) {
              lVar16 = 0;
              do {
                if (0 < (int)local_698._12_4_) {
                  lVar23 = 0;
                  do {
                    fVar28 = *(float *)(*local_650 * lVar16 + local_688[0]._M_allocated_capacity +
                                       lVar23 * 4);
                    uVar25 = -(uint)(fVar28 < 1.1920929e-07);
                    fVar28 = logf((float)(uVar25 & 0x38d1b717 | ~uVar25 & (uint)fVar28));
                    *(float *)(**(long **)(local_728.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x48)
                               * lVar16 +
                               *(long *)(local_728.
                                         super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x10) +
                              lVar23 * 4) = fVar28;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 < (int)local_698._12_4_);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_698._8_4_);
            }
            lVar20 = (long)local_868 * 0x60;
            local_7e8[0]._M_string_length =
                 (size_type)
                 (local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar20);
            local_7e8[0].field_2._M_allocated_capacity = 0;
            local_7e8[0]._M_dataplus._M_p._0_4_ = 0x1010000;
            local_788._8_8_ =
                 local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar20;
            local_788._16_4_ = 0;
            local_788._20_4_ = 0;
            local_788._0_4_ = 0x2010000;
            local_6f8[0].sz.width = 0;
            local_6f8[0].sz.height = 0;
            local_6f8[0].flags = 0x1010000;
            local_6f8[0].obj = local_440;
            local_460[2] = 0xffffffffffffffff;
            cv::filter2D(local_7e8,(_InputArray *)local_788,5,local_6f8,local_460 + 2,4);
            local_7e8[0]._M_string_length =
                 (size_type)
                 (local_728.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar20);
            local_7e8[0].field_2._M_allocated_capacity = 0;
            local_7e8[0]._M_dataplus._M_p._0_4_ = 0x1010000;
            local_788._8_8_ =
                 local_538.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar20;
            local_788._16_4_ = 0;
            local_788._20_4_ = 0;
            local_788._0_4_ = 0x2010000;
            local_6f8[0].sz.width = 0;
            local_6f8[0].sz.height = 0;
            local_6f8[0].flags = 0x1010000;
            local_6f8[0].obj = local_150;
            local_460[1] = 0xffffffffffffffff;
            cv::filter2D(local_7e8,(_InputArray *)local_788,5,local_6f8,local_460 + 1,4);
            local_7e8[0]._M_string_length =
                 (size_type)
                 (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar20);
            local_7e8[0].field_2._M_allocated_capacity = 0;
            local_7e8[0]._M_dataplus._M_p._0_4_ = 0x1010000;
            local_788._8_8_ =
                 local_538.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar20;
            local_788._16_4_ = 0;
            local_788._20_4_ = 0;
            local_788._0_4_ = 0x1010000;
            local_6f8[0].obj =
                 local_4b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar20;
            local_6f8[0].sz.width = 0;
            local_6f8[0].sz.height = 0;
            local_6f8[0].flags = 0x2010000;
            cv::magnitude((_InputArray *)local_7e8,(_InputArray *)local_788,
                          (_OutputArray *)local_6f8);
            cv::Mat::~Mat((Mat *)local_698);
            SVar21 = (Size)((long)local_868 + 1);
          } while ((ulong)SVar21 <
                   (ulong)(((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 5) *
                          -0x5555555555555555));
        }
        cv::Mat::Mat((Mat *)local_7e8);
        cv::Mat::Mat((Mat *)local_698);
        cv::Mat::Mat((Mat *)local_788);
        local_6f8[0].sz.width = 0;
        local_6f8[0].sz.height = 0;
        local_6f8[0].flags = 0x1010000;
        local_1b0[0].sz.width = 0;
        local_1b0[0].sz.height = 0;
        local_1b0[0].flags = 0x2010000;
        local_f0[0].super__InputArray.sz.width = 0;
        local_f0[0].super__InputArray.sz.height = 0;
        local_f0[0].super__InputArray.flags = 0x1010000;
        local_f0[0].super__InputArray.obj = local_440;
        local_220 = 0xffffffffffffffff;
        local_6f8[0].obj = local_348;
        local_1b0[0].obj = (Mat *)local_698;
        cv::filter2D(local_6f8,local_1b0,5,local_f0,&local_220,4);
        local_6f8[0].sz.width = 0;
        local_6f8[0].sz.height = 0;
        local_6f8[0].flags = 0x1010000;
        local_1b0[0].sz.width = 0;
        local_1b0[0].sz.height = 0;
        local_1b0[0].flags = 0x2010000;
        local_f0[0].super__InputArray.sz.width = 0;
        local_f0[0].super__InputArray.sz.height = 0;
        local_f0[0].super__InputArray.flags = 0x1010000;
        local_f0[0].super__InputArray.obj = local_150;
        local_228 = 0xffffffffffffffff;
        local_6f8[0].obj = local_348;
        local_1b0[0].obj = (Mat *)local_788;
        cv::filter2D(local_6f8,local_1b0,5,local_f0,&local_228,4);
        local_6f8[0].sz.width = 0;
        local_6f8[0].sz.height = 0;
        local_6f8[0].flags = 0x1010000;
        local_1b0[0].sz.width = 0;
        local_1b0[0].sz.height = 0;
        local_1b0[0].flags = 0x1010000;
        local_f0[0].super__InputArray.sz.width = 0;
        local_f0[0].super__InputArray.sz.height = 0;
        local_f0[0].super__InputArray.flags = 0x2010000;
        local_6f8[0].obj = (Mat *)local_698;
        local_1b0[0].obj = (Mat *)local_788;
        local_f0[0].super__InputArray.obj = local_7e8;
        cv::magnitude(local_6f8,local_1b0,local_f0);
        cv::Mat::~Mat((Mat *)local_788);
        cv::Mat::~Mat((Mat *)local_698);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                  (&local_360,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                   (allocator_type *)local_698);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&local_4a0,
                   ((long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                   (allocator_type *)local_698);
        if (local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_858.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar17 = 0;
          do {
            lVar20 = uVar17 * 0x60;
            local_460[0] = **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) << 0x20 |
                           **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) >> 0x20;
            cv::Mat::Mat((Mat *)local_788,local_460,5);
            local_480[3] = **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) << 0x20 |
                           **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) >> 0x20;
            local_840 = uVar17;
            cv::Mat::Mat((Mat *)local_6f8,local_480 + 3,5);
            iVar9 = *(int *)(local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar20 + 8);
            if (0 < (long)iVar9) {
              uVar25 = *(uint *)(local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar20 + 0xc);
              local_868.width = local_788._16_4_;
              local_868.height = local_788._20_4_;
              lVar16 = 0;
              do {
                if (0 < (int)uVar25) {
                  lVar23 = *local_398;
                  lVar10 = *local_6b0;
                  lVar18 = *local_740 * lVar16 + local_788._16_8_;
                  uVar17 = 0;
                  do {
                    if (*(byte *)(lVar23 * lVar16 + local_3d0[0] + uVar17) < 0x65) {
                      *(undefined4 *)(lVar18 + uVar17 * 4) =
                           *(undefined4 *)
                            (**(long **)(local_838.
                                         super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x48) *
                             lVar16 + *(long *)(local_838.
                                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                               lVar20 + 0x10) + uVar17 * 4);
                      uVar26 = *(undefined4 *)
                                (**(long **)(local_538.
                                             super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                            lVar20 + 0x48) * lVar16 +
                                 *(long *)(local_538.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x10)
                                + uVar17 * 4);
                    }
                    else {
                      *(undefined4 *)(lVar18 + uVar17 * 4) = 0;
                      uVar26 = 0;
                    }
                    *(undefined4 *)(lVar10 * lVar16 + (long)local_6f8[0].sz + uVar17 * 4) = uVar26;
                    uVar17 = uVar17 + 1;
                  } while (uVar25 != uVar17);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != iVar9);
            }
            local_860 = lVar20;
            cv::Mat::Mat((Mat *)local_1b0);
            cv::Mat::Mat((Mat *)local_f0);
            local_688[0]._0_4_ = 0;
            local_688[0]._4_4_ = 0;
            local_698._0_4_ = 0x1010000;
            local_698._8_8_ = local_788;
            lStack_278 = 0;
            local_288[0] = 0x2010000;
            local_700 = 0;
            local_710._0_4_ = 0x1010000;
            local_708 = (Mat *)local_440;
            local_480[2] = 0xffffffffffffffff;
            local_280 = local_1b0;
            cv::filter2D((Mat *)local_698,(Mat *)local_288,5,&local_710,local_480 + 2,4);
            local_688[0]._0_4_ = 0;
            local_688[0]._4_4_ = 0;
            local_698._0_4_ = 0x1010000;
            local_698._8_8_ = local_6f8;
            lStack_278 = 0;
            local_288[0] = 0x2010000;
            local_700 = 0;
            local_710 = CONCAT44(local_710._4_4_,0x1010000);
            local_708 = local_150;
            local_480[1] = 0xffffffffffffffff;
            local_280 = (_InputArray *)local_f0;
            cv::filter2D((Mat *)local_698,(Mat *)local_288,5,&local_710,local_480 + 1,4);
            cv::operator+((Mat *)local_698,(Mat *)local_1b0);
            cv::Mat::Mat((Mat *)local_288);
            (**(code **)(*(long *)local_698._0_8_ + 0x18))
                      (local_698._0_8_,(Mat *)local_698,(Mat *)local_288,0xffffffff);
            cv::Mat::~Mat(local_5c8);
            cv::Mat::~Mat(local_628);
            cv::Mat::~Mat((Mat *)(local_698 + 0x10));
            lVar20 = local_840 * 0x60;
            p_Var24 = (_InputArray *)
                      (local_360.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar20);
            local_480[0] = **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) << 0x20 |
                           **(ulong **)
                             (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar20 + 0x40) >> 0x20;
            cv::Mat::create(p_Var24,local_480,5);
            local_710 = 0x4012d68f15c8a4a1;
            local_698._0_4_ = 0xc1020006;
            local_698._8_8_ = &local_710;
            local_688[0]._0_4_ = 1;
            local_688[0]._4_4_ = 1;
            cv::noArray();
            cv::Mat::setTo(p_Var24,(_InputArray *)local_698);
            uVar25 = *(uint *)(local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_860 + 8);
            local_7f8 = (ulong)uVar25;
            local_800 = local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start + local_860;
            iVar9 = 0;
            do {
              local_868.width = iVar9;
              if (4 < (int)uVar25) {
                iVar8 = *(int *)(local_800 + 0xc);
                uVar17 = 2;
                lVar23 = 4;
                lVar16 = 0;
                do {
                  if (4 < iVar8) {
                    SVar21 = p_Var24->sz;
                    lVar10 = **(long **)(p_Var24 + 3);
                    lVar18 = *local_240;
                    lVar19 = lVar10 * uVar17 + (long)SVar21;
                    uVar15 = 2;
                    do {
                      fVar28 = *(float *)(lVar19 + uVar15 * 4);
                      *(float *)(lVar19 + uVar15 * 4) =
                           ((fVar28 * -4.0 +
                            *(float *)(lVar19 + -8 + uVar15 * 4) +
                            *(float *)(lVar19 + 8 + uVar15 * 4) +
                            *(float *)(lVar10 * lVar16 + (long)SVar21 + uVar15 * 4) +
                            *(float *)(lVar10 * lVar23 + (long)SVar21 + uVar15 * 4)) * 0.25 -
                           *(float *)(lVar18 * uVar17 + lStack_278 + uVar15 * 4)) + fVar28;
                      uVar15 = uVar15 + 1;
                    } while (iVar8 - 2 != uVar15);
                  }
                  uVar17 = uVar17 + 1;
                  lVar23 = lVar23 + 1;
                  lVar16 = lVar16 + 1;
                } while (uVar17 != uVar25 - 2);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != 20000);
            local_4a0.field_2._8_8_ =
                 **(ulong **)
                   (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar20 + 0x40) << 0x20 |
                 **(ulong **)
                   (local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar20 + 0x40) >> 0x20;
            cv::Mat::create(local_4a0._M_dataplus._M_p + lVar20,
                            (undefined1 *)((long)&local_4a0.field_2 + 8),0);
            if (0 < *(int *)(local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_start + local_860 + 8)) {
              lVar16 = 0;
              do {
                if (0 < *(int *)(local_838.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start + local_860 + 0xc)) {
                  lVar23 = 0;
                  do {
                    fVar27 = expf(*(float *)(**(long **)(p_Var24 + 3) * lVar16 + (long)p_Var24->sz +
                                            lVar23 * 4));
                    fVar28 = 255.0;
                    if (fVar27 <= 255.0) {
                      fVar28 = fVar27;
                    }
                    *(char *)(lVar23 + **(long **)(local_4a0._M_dataplus._M_p + lVar20 + 0x48) *
                                       lVar16 + *(long *)(local_4a0._M_dataplus._M_p + lVar20 + 0x10
                                                         )) = (char)(int)fVar28;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 < *(int *)(local_838.
                                             super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar20 + 0xc
                                            ));
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < *(int *)(local_838.
                                         super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start + local_860 + 8));
            }
            cv::Mat::~Mat((Mat *)local_288);
            cv::Mat::~Mat((Mat *)local_f0);
            cv::Mat::~Mat((Mat *)local_1b0);
            cv::Mat::~Mat((Mat *)local_6f8);
            cv::Mat::~Mat((Mat *)local_788);
            uVar17 = local_840 + 1;
          } while (uVar17 < (ulong)(((long)local_858.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_858.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 5) *
                                   -0x5555555555555555));
        }
        cv::Mat::Mat((Mat *)local_698);
        local_788._16_4_ = 0;
        local_788._20_4_ = 0;
        local_788._0_4_ = 0x1050000;
        local_788._8_8_ = &local_4a0;
        local_6f8[0].sz.width = 0;
        local_6f8[0].sz.height = 0;
        local_6f8[0].flags = 0x2010000;
        local_6f8[0].obj = (Mat *)local_698;
        cv::merge((_InputArray *)local_788,(_OutputArray *)local_6f8);
        local_788._0_8_ = (pointer)(local_788 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"reconstructed_img","");
        local_6f8[0].sz.width = 0;
        local_6f8[0].sz.height = 0;
        local_6f8[0].flags = 0x1010000;
        local_6f8[0].obj = local_698;
        cv::imshow((string *)local_788,local_6f8);
        if ((pointer)local_788._0_8_ != (pointer)(local_788 + 0x10)) {
          operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
        }
        cv::waitKey(0);
        cv::Mat::~Mat((Mat *)local_698);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&local_4a0);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_360);
        cv::Mat::~Mat((Mat *)local_7e8);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_538);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_838);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_4b8);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_728);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_858);
        cv::Mat::~Mat((Mat *)local_3e0);
        cv::Mat::~Mat((Mat *)local_90);
        cv::Mat::~Mat(local_348);
        cv::Mat::~Mat(local_210);
        cv::Mat::~Mat((Mat *)local_2e8);
        cv::Mat::~Mat((Mat *)local_518);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
LAB_001166ee:
        cv::CommandLineParser::~CommandLineParser(local_870);
        if (local_820[0] != local_810) {
          operator_delete(local_820[0],local_810[0] + 1);
        }
        cv::Mat::~Mat(local_150);
        cv::Mat::~Mat((Mat *)local_440);
        return 0;
      }
      goto LAB_00116780;
    }
  }
  std::__throw_invalid_argument("stof");
LAB_00116780:
  uVar13 = std::__throw_invalid_argument("stof");
  if ((int *)local_7e8[0]._M_dataplus._M_p != piVar12) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
    operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
  }
  cv::Mat::~Mat((Mat *)local_3e0);
  cv::Mat::~Mat((Mat *)local_90);
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat((Mat *)local_2e8);
  cv::Mat::~Mat((Mat *)local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  cv::CommandLineParser::~CommandLineParser(local_870);
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat((Mat *)local_440);
  _Unwind_Resume(uVar13);
}

Assistant:

int main(int argc, const char* argv[])
{

    cv::Mat filter_gx(1, 3, CV_32F);
    filter_gx.at<float>(0) = -0.5f;
    filter_gx.at<float>(1) = 0.0f;
    filter_gx.at<float>(2) = 0.5f;
    cv::Mat filter_gy = filter_gx.t();

    const std::string keys =
        "{help h usage ? |      | print this message                                                        }"
        "{@image1        |      | image1 for compare                                                        }"
        "{roi            |      | roi to delete canny edges                                                 }"
        "{thrs1          |200   | Canny threshold for grayscale image                                       }"
        "{thrs2          |200   | Canny threshold for invariant image                                       }"
        "{c1             |0.5463| Illuminant invariant direction c1                                         }"
        "{c2             |-0.837| Illuminant invariant direction c2                                         }"
        "{calibrate      |false | Manually calibrate [c1, c2] direction                                     }"
        "{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
        ;
    cv::CommandLineParser parser(argc, argv, keys);

    if (parser.has("help"))
    {
        parser.printMessage();
        return 0;
    }

    std::string img1 = parser.get<std::string>(0);
    float img_canny_thrs = parser.get<float>("thrs1");
    float ii_img_canny_thrs = parser.get<float>("thrs2");
    float c1 = parser.get<float>("c1");
    float c2 = parser.get<float>("c2");
    bool calibrate = parser.get<bool>("calibrate");
    int mode = parser.get<int>("mode");

    cv::Mat img = cv::imread(img1);
    //cv::Mat img2;
    //cv::resize(img, img2, cv::Size(img.cols / 2, img.rows / 2));
    //img = img2;
    cv::imshow("Original", img);

    cv::Mat log_r_g(img.rows, img.cols, CV_32F), log_b_g(img.rows, img.cols, CV_32F);
    for (int j = 0; j < img.rows; ++j)
    {
        for (int i = 0; i < img.cols; ++i)
        {
            cv::Vec3b color = img.at<cv::Vec3b>(j, i);
            log_r_g.at<float>(j, i) = 0;
            log_b_g.at<float>(j, i) = 0;
            if (color[1] != 0)
            {
                float scale = color[1];
                if (color[2] != 0)
                    log_r_g.at<float>(j, i) = std::log(color[2] / scale );
                if (color[0] != 0)
                    log_b_g.at<float>(j, i) = std::log(color[0] / scale);
            }
        }
    }

    auto combineLogImages = [](const cv::Mat& log_r_g, const cv::Mat& log_b_g, cv::Mat& img_res, const float c1, const float c2)
    {
        for (int j = 0; j < img_res.rows; ++j)
        {
            for (int i = 0; i < img_res.cols; ++i)
            {
                img_res.at<float>(j, i) = std::abs(c1 * log_r_g.at<float>(j, i) - c2 * log_b_g.at<float>(j, i));
            }
        }
    };

    cv::Mat illuminant_invariant_img(log_r_g.size(), CV_32F);
    combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
    cv::Mat illuminant_invariant_img_exp;

    if (calibrate)
    {
        //create trackbar window
        const std::string winname = "Invariant direction slider";
        const std::string slider_name = "ids";
        cv::namedWindow(winname, cv::WINDOW_AUTOSIZE); // Create Window
        int val = 0, val_curr = -1;

        int max_val = 1000;
        cv::createTrackbar(slider_name, winname, &val, max_val, onIDSslider);

        bool calib_done = false;
        while (!calib_done)
        {
            if (val != val_curr)
            {
                val_curr = val;
                c1 = std::cos(val / (float)max_val * 2 * 3.141592f);
                c2 = std::sin(val / (float)max_val * 2 * 3.141592f);
                std::cout << c1 << "   " << c2 << std::endl;
                combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
                cv::exp(illuminant_invariant_img, illuminant_invariant_img_exp);
                cv::imshow(winname, illuminant_invariant_img_exp / 2);
            }
            int key = cv::waitKey(50);
            if (key == 27)
            {
                calib_done = true;
            }
        }
    }
    cv::Mat edges_to_remove;
    if (mode == 0)
    {
        calculateShadowEdges(illuminant_invariant_img, img, edges_to_remove, int(ii_img_canny_thrs), int(img_canny_thrs));
    }
    else if (mode == 1)
    {
        cv::Rect roi(0, 0, img.cols, img.rows);
        if (parser.has("roi"))
        {
            std::string roi_str = parser.get<std::string>("roi");
            auto rois = split(roi_str, "x");
            assert(rois.size() == 4);
            roi.x = int(std::stof(rois[0]) * roi.width);
            roi.y = int(std::stof(rois[1]) * roi.height);
            roi.width = int(std::stof(rois[2]) * roi.width);
            roi.height = int(std::stof(rois[3]) * roi.height);
        }
        calculateShadowEdgesRoi(img, roi, edges_to_remove, int(img_canny_thrs));
    }
    cv::imshow("Edges to remove", edges_to_remove);
    cv::waitKey(1);
    //split color channels and calculate log (color/gradient magnitude) images
    std::vector<cv::Mat> bgr_channels, bgr_channels_log, log_grad, log_dx, log_dy;
    cv::split(img, bgr_channels);
    bgr_channels_log.resize(bgr_channels.size());
    log_grad.resize(bgr_channels.size());
    log_dx.resize(bgr_channels.size());
    log_dy.resize(bgr_channels.size());
    for (size_t i = 0; i < bgr_channels.size(); ++i)
    {
        cv::Mat float_img;
        bgr_channels[i].convertTo(float_img, CV_32F);
        bgr_channels_log[i].create(float_img.size(), CV_32FC1);
        for (int l = 0; l < float_img.rows; ++l)
        {
            for (int k = 0; k < float_img.cols; ++k)
            {
                float int_val = float_img.at<float>(l, k);
                if (int_val < std::numeric_limits<float>::epsilon())
                    int_val = 0.0001f;
                bgr_channels_log[i].at<float>(l, k) = std::log(int_val);
            }
        }
        cv::filter2D(bgr_channels_log[i], log_dx[i], CV_32F, filter_gx);
        cv::filter2D(bgr_channels_log[i], log_dy[i], CV_32F, filter_gy);
        cv::magnitude(log_dx[i], log_dy[i], log_grad[i]);
    }

    //calculate gradient of the illuminant invariant image
    cv::Mat grad_iii;
    {
        cv::Mat dx, dy;
        cv::filter2D(illuminant_invariant_img, dx, CV_32F, filter_gx);
        cv::filter2D(illuminant_invariant_img, dy, CV_32F, filter_gy);
        cv::magnitude(dx, dy, grad_iii);
    }
    //solving for color image
    std::vector<cv::Mat> re_log_channels(bgr_channels.size());
    std::vector<cv::Mat> re_channels(bgr_channels.size());
    //iterate over image channel and remove color edges belonging to shadows, restore original image channels
    for (size_t k = 0; k < bgr_channels.size(); ++k)
    {
        cv::Mat S_x(log_dx[k].size(), CV_32FC1);
        cv::Mat S_y(log_dx[k].size(), CV_32FC1);

        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                auto& s_x = S_x.at<float>(j, i);
                auto& s_y = S_y.at<float>(j, i);
                float edge_to_remove = edges_to_remove.at<uchar>(j, i);

                if (edge_to_remove > 100) //shadow edge
                {
                    s_x = 0;
                    s_y = 0;
                }
                else
                {
                    //std::cout << ii_grad << std::endl;
                    s_x = log_dx[k].at<float>(j, i);
                    s_y = log_dy[k].at<float>(j, i);
                }
            }
        }

        //calculate laplacian of the edge map, shadows already removed
        cv::Mat S_x_dx, S_y_dy;
        cv::filter2D(S_x, S_x_dx, CV_32F, filter_gx);
        cv::filter2D(S_y, S_y_dy, CV_32F, filter_gy);
        cv::Mat S_lap = S_x_dx + S_y_dy;

        cv::Mat& u = re_log_channels[k];

        //set boundary to some common value
        u.create(log_dx[k].size(), CV_32FC1);
        u.setTo(std::log(111));

        //lots of iteration required to restore the original image from the laplacian
        for (int it = 0; it < 20000; ++it)
        {
            for (int j = 2; j < log_dx[k].rows - 2; ++j)
            {
                for (int i = 2; i < log_dx[k].cols - 2; ++i)
                {
                    float lap_ = 
                        0.25f * (
                            u.at<float>(j, i - 2) + u.at<float>(j, i + 2) +
                        u.at<float>(j - 2, i) + u.at<float>(j + 2, i) -
                        4.0f * u.at<float>(j, i));
        
        
                    u.at<float>(j, i) +=
                        lap_ - S_lap.at<float>(j, i);
                }
            }
        }

        re_channels[k].create(log_dx[k].size(), CV_8UC1);
        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                re_channels[k].at<uint8_t>(j, i) = uint8_t(std::min(std::exp(u.at<float>(j, i)) * 1.f, 255.0f));
            }
        }
    }
    cv::Mat reconstructed_img;
    cv::merge(re_channels, reconstructed_img);

    cv::imshow("reconstructed_img", reconstructed_img);

    cv::waitKey(0);
    return 0;
}